

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O2

int sat_solver3_solve(sat_solver3 *s,lit *begin,lit *end,ABC_INT64_T nConfLimit,
                     ABC_INT64_T nInsLimit,ABC_INT64_T nConfLimitGlobal,ABC_INT64_T nInsLimitGlobal)

{
  int iVar1;
  
  if (s->fSolved == 0) {
    if (s->fVerbose != 0) {
      printf("Running SAT solver with parameters %d and %d and %d.\n",(ulong)(uint)s->nLearntStart,
             (ulong)(uint)s->nLearntDelta,(ulong)(uint)s->nLearntRatio);
    }
    sat_solver3_set_resource_limits(s,nConfLimit,nInsLimit,nConfLimitGlobal,nInsLimitGlobal);
    s->root_level = 0;
    do {
      if (end <= begin) {
        if (s->root_level != (s->trail_lim).size) {
          __assert_fail("s->root_level == sat_solver3_dl(s)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                        ,0x7f3,
                        "int sat_solver3_solve(sat_solver3 *, lit *, lit *, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T, ABC_INT64_T)"
                       );
        }
        iVar1 = sat_solver3_solve_internal(s);
        sat_solver3_canceluntil(s,0);
        goto LAB_00727abd;
      }
      iVar1 = sat_solver3_push(s,*begin);
      begin = begin + 1;
    } while (iVar1 != 0);
    sat_solver3_canceluntil(s,0);
    iVar1 = -1;
LAB_00727abd:
    s->root_level = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int sat_solver3_solve(sat_solver3* s, lit* begin, lit* end, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, ABC_INT64_T nConfLimitGlobal, ABC_INT64_T nInsLimitGlobal)
{
    lbool status;
    lit * i;
    if ( s->fSolved )
        return l_False;

    if ( s->fVerbose )
        printf( "Running SAT solver with parameters %d and %d and %d.\n", s->nLearntStart, s->nLearntDelta, s->nLearntRatio );

    sat_solver3_set_resource_limits( s, nConfLimit, nInsLimit, nConfLimitGlobal, nInsLimitGlobal );

#ifdef SAT_USE_ANALYZE_FINAL
    // Perform assumptions:
    s->root_level = 0;
    for ( i = begin; i < end; i++ )
        if ( !sat_solver3_push(s, *i) )
        {
            sat_solver3_canceluntil(s,0);
            s->root_level = 0;
            return l_False;
        }
    assert(s->root_level == sat_solver3_dl(s));
#else
    //printf("solve: "); printlits(begin, end); printf("\n");
    for (i = begin; i < end; i++){
//        switch (lit_sign(*i) ? -s->assignss[lit_var(*i)] : s->assignss[lit_var(*i)]){
        switch (var_value(s, *i)) {
        case var1: // l_True: 
            break;
        case varX: // l_Undef
            sat_solver3_decision(s, *i);
            if (sat_solver3_propagate(s) == 0)
                break;
            // fallthrough
        case var0: // l_False 
            sat_solver3_canceluntil(s, 0);
            return l_False;
        }
    }
    s->root_level = sat_solver3_dl(s);
#endif

    status = sat_solver3_solve_internal(s);

    sat_solver3_canceluntil(s,0);
    s->root_level = 0;
    return status;
}